

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void C_ToggleConsole(void)

{
  if ((gamestate == GS_DEMOSCREEN) || (demoplayback)) {
    gameaction = ga_fullconsole;
    return;
  }
  if ((chatmodeon == 0) &&
     ((ConsoleState == c_up || ConsoleState == c_rising && (menuactive == MENU_Off)))) {
    HistPos = (History *)0x0;
    ConsoleState = c_falling;
    TabbedLast = 0;
    TabbedList = 0;
    return;
  }
  if ((gamestate & GS_FORCEWIPEBURN) == GS_FULLCONSOLE) {
    return;
  }
  ConsoleState = c_rising;
  C_FlushDisplay();
  return;
}

Assistant:

void C_ToggleConsole ()
{
	if (gamestate == GS_DEMOSCREEN || demoplayback)
	{
		gameaction = ga_fullconsole;
	}
	else if (!chatmodeon && (ConsoleState == c_up || ConsoleState == c_rising) && menuactive == MENU_Off)
	{
		ConsoleState = c_falling;
		HistPos = NULL;
		TabbedLast = false;
		TabbedList = false;
	}
	else if (gamestate != GS_FULLCONSOLE && gamestate != GS_STARTUP)
	{
		ConsoleState = c_rising;
		C_FlushDisplay ();
	}
}